

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PStruct::PStruct(PStruct *this,FName *name,PTypeBase *outer)

{
  char *pcVar1;
  FName local_24;
  PTypeBase *local_20;
  PTypeBase *outer_local;
  FName *name_local;
  PStruct *this_local;
  
  local_20 = outer;
  outer_local = (PTypeBase *)name;
  name_local = (FName *)this;
  FName::FName(&local_24,name);
  PNamedType::PNamedType(&this->super_PNamedType,&local_24,local_20);
  (this->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
  _vptr_DObject = (_func_int **)&PTR_StaticType_009f3ad8;
  TArray<PField_*,_PField_*>::TArray(&this->Fields);
  pcVar1 = FName::GetChars(name);
  FString::Format(&(this->super_PNamedType).super_PCompoundType.super_PType.mDescriptiveName,
                  "Struct<%s>",pcVar1);
  *(undefined4 *)
   &(this->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    field_0x24 = 0;
  this->HasNativeFields = false;
  return;
}

Assistant:

PStruct::PStruct(FName name, PTypeBase *outer)
: PNamedType(name, outer)
{
	mDescriptiveName.Format("Struct<%s>", name.GetChars());
	Size = 0;
	HasNativeFields = false;
}